

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O3

N * __thiscall N::ana<std::__cxx11::string>(N *this,CoAlg<std::__cxx11::basic_string<char>_> *coalg)

{
  variant_alternative_t<0UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_int,_double,_NS_*>_>
  *pvVar1;
  N *this_00;
  undefined8 uVar2;
  _Any_data local_60;
  code *local_50;
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> local_40 [32];
  
  pvVar1 = std::get<0ul,std::__cxx11::string,int,double,NS*>(&this->data);
  if ((coalg->super__Function_base)._M_manager != (_Manager_type)0x0) {
    this_00 = (*coalg->_M_invoker)((_Any_data *)coalg,pvVar1);
    all(this_00);
    std::
    function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_60,coalg);
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    mapped<N::ana<std::__cxx11::string>(std::function<N*(std::__cxx11::string&)>const&)::_lambda(N*)_1_>
              (local_40,(anon_class_32_1_a7c0f4d0 *)&local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    return this_00;
  }
  uVar2 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar2);
}

Assistant:

N* ana(const coalg::CoAlg<A>& coalg) {
        auto r = coalg(std::get<A>(this->data));

        r->all().mapped([coalg](N* n){return n->ana(coalg);});

        return r;
    }